

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<long&>
          (PeerManagerImpl *this,CNode *node,string *msg_type,long *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CConnman *this_00;
  size_type sVar2;
  string msg_type_00;
  long in_FS_OFFSET;
  pointer pcVar3;
  size_type sVar4;
  undefined8 in_stack_ffffffffffffffa0;
  CSerializedNetMsg local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(CConnman **)(this + 0x100);
  pcVar3 = (msg_type->_M_dataplus)._M_p;
  paVar1 = &msg_type->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    sVar4 = paVar1->_M_allocated_capacity;
    in_stack_ffffffffffffffa0 = *(undefined8 *)((long)&msg_type->field_2 + 8);
    pcVar3 = &stack0xffffffffffffff98;
  }
  else {
    sVar4 = paVar1->_M_allocated_capacity;
  }
  sVar2 = msg_type->_M_string_length;
  (msg_type->_M_dataplus)._M_p = (pointer)paVar1;
  msg_type->_M_string_length = 0;
  (msg_type->field_2)._M_local_buf[0] = '\0';
  msg_type_00._M_string_length = sVar2;
  msg_type_00._M_dataplus._M_p = pcVar3;
  msg_type_00.field_2._M_allocated_capacity = sVar4;
  msg_type_00.field_2._8_8_ = in_stack_ffffffffffffffa0;
  NetMsg::Make<long&>(&local_58,(NetMsg *)&stack0xffffffffffffff88,msg_type_00,args);
  CConnman::PushMessage(this_00,node,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_type._M_dataplus._M_p != &local_58.m_type.field_2) {
    operator_delete(local_58.m_type._M_dataplus._M_p,
                    local_58.m_type.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pcVar3 != &stack0xffffffffffffff98) {
    operator_delete(pcVar3,sVar4 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeAndPushMessage(CNode& node, std::string msg_type, Args&&... args) const
    {
        m_connman.PushMessage(&node, NetMsg::Make(std::move(msg_type), std::forward<Args>(args)...));
    }